

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_2_5::anon_unknown_18::jacobiRotateRight<double>
               (Matrix44<double> *A,int j,int k,double c,double s)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int in_EDX;
  int in_ESI;
  Matrix44<double> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double tau2;
  double tau1;
  int i;
  int local_24;
  
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pdVar3 = Matrix44<double>::operator[](in_RDI,local_24);
    dVar1 = pdVar3[in_ESI];
    pdVar3 = Matrix44<double>::operator[](in_RDI,local_24);
    dVar2 = pdVar3[in_EDX];
    pdVar3 = Matrix44<double>::operator[](in_RDI,local_24);
    pdVar3[in_ESI] = in_XMM0_Qa * dVar1 + -(in_XMM1_Qa * dVar2);
    pdVar3 = Matrix44<double>::operator[](in_RDI,local_24);
    pdVar3[in_EDX] = in_XMM1_Qa * dVar1 + in_XMM0_Qa * dVar2;
  }
  return;
}

Assistant:

void
jacobiRotateRight (IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
                   const int j,
                   const int k,
                   const T c,
                   const T s)
{
    for (int i = 0; i < 4; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j] = c * tau1 - s * tau2;
        A[i][k] = s * tau1 + c * tau2;
    }
}